

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_4::PtexUtils::anon_unknown_1::divalpha<unsigned_char>
               (uchar *data,int npixels,int nchannels,int alphachan,float scale)

{
  byte bVar1;
  uchar *puVar2;
  int i;
  float aval;
  uchar alpha;
  uchar *end;
  int nchandiv;
  int alphaoffset;
  float scale_local;
  int alphachan_local;
  int nchannels_local;
  int npixels_local;
  uchar *data_local;
  
  nchandiv = alphachan;
  alphaoffset = alphachan;
  data_local = data;
  if (alphachan == 0) {
    data_local = data + 1;
    alphaoffset = -1;
    nchandiv = nchannels + -1;
  }
  puVar2 = data_local + npixels * nchannels;
  for (; data_local != puVar2; data_local = data_local + nchannels) {
    bVar1 = data_local[alphaoffset];
    if (bVar1 != 0) {
      for (i = 0; i < nchandiv; i = i + 1) {
        data_local[i] = (uchar)(int)((float)data_local[i] * (scale / (float)bVar1));
      }
    }
  }
  return;
}

Assistant:

inline void divalpha(T* data, int npixels, int nchannels, int alphachan, float scale)
    {
        int alphaoffset; // offset to alpha chan from data ptr
        int nchandiv;    // number of channels to alpha-divide
        if (alphachan == 0) {
            // first channel is alpha chan: div the rest of the channels
            data++;
            alphaoffset = -1;
            nchandiv = nchannels - 1;
        }
        else {
            // div all channels up to alpha chan
            alphaoffset = alphachan;
            nchandiv = alphachan;
        }

        for (T* end = data + npixels*nchannels; data != end; data += nchannels) {
            T alpha = data[alphaoffset];
            if (!alpha) continue; // don't divide by zero!
            float aval = scale / (float)alpha;
            for (int i = 0; i < nchandiv; i++)  data[i] = T((float)data[i] * aval);
        }
    }